

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCount.h
# Opt level: O2

SmartPtr<Timer> * __thiscall SmartPtr<Timer>::operator=(SmartPtr<Timer> *this,Timer *obj)

{
  if (obj != (Timer *)0x0) {
    RefCount::AddRef((RefCount *)obj);
  }
  if ((RefCount *)this->mObj != (RefCount *)0x0) {
    RefCount::Release((RefCount *)this->mObj);
  }
  this->mObj = obj;
  return this;
}

Assistant:

SmartPtr &operator=( T *obj )	
	{ 
		//printf( "SmartPtr = start\n" );
		if ( obj != NULL)
		{
			obj->AddRef();
		}

		if ( mObj != NULL )
			mObj->Release();
		mObj = obj;
		
		//printf( "SmartPtr = stop\n" );
		return *this;
	}